

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS VerifyOnlyTrailingWhiteSpace(char *String,_Bool IsJson5)

{
  JL_STATUS JVar1;
  size_t local_38;
  size_t errorAtPos;
  size_t sStack_28;
  JL_DATA_TYPE newType;
  size_t newIndex;
  size_t len;
  JL_STATUS jlStatus;
  _Bool IsJson5_local;
  char *String_local;
  
  len._7_1_ = IsJson5;
  _jlStatus = String;
  newIndex = strlen(String);
  sStack_28 = 0;
  errorAtPos._4_4_ = 0;
  local_38 = 0;
  JVar1 = DetectNewType(_jlStatus,newIndex,0,(_Bool)(len._7_1_ & 1),&stack0xffffffffffffffd8,
                        (JL_DATA_TYPE *)((long)&errorAtPos + 4),&local_38);
  if (JVar1 == JL_STATUS_SUCCESS) {
    len._0_4_ = JL_STATUS_INVALID_DATA;
  }
  else {
    len._0_4_ = JL_STATUS_SUCCESS;
  }
  return (JL_STATUS)len;
}

Assistant:

static
JL_STATUS
    VerifyOnlyTrailingWhiteSpace
    (
        char const*         String,
        bool                IsJson5
    )
{
    JL_STATUS jlStatus;
    size_t len = strlen( String );
    size_t newIndex = 0;
    JL_DATA_TYPE newType = JL_DATA_TYPE_NONE;
    size_t errorAtPos = 0;

    // We should not be able to detect a new type, this should just scan through white space and comments that
    // may be trailing.
    jlStatus = DetectNewType( String, len, 0, IsJson5, &newIndex, &newType, &errorAtPos );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        // This is an error as we should not have found a type
        jlStatus = JL_STATUS_INVALID_DATA;
    }
    else
    {
        // This is good, we should not have found anything
        jlStatus = JL_STATUS_SUCCESS;
    }

    return jlStatus;
}